

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *this;
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  VolumeFile *this_00;
  options_description_easy_init *poVar4;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar5;
  options_description *poVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  any *paVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  size_t sVar13;
  long lVar14;
  int iVar15;
  char *pcVar16;
  VolumeFile *this_01;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uint8_t key [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  restParams;
  variables_map restVarMap;
  basic_parsed_options<char> parsedOpts;
  options_description decryptOpts;
  options_description generalOpts;
  variables_map restVarMap_1;
  options_description allOpts;
  options_description unpackOpts;
  Salsa20Cipher cipher;
  variables_map varMap;
  GT7VolumeFile vol7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d28;
  path local_d08;
  path local_ce8;
  key_type local_cc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ca8;
  undefined1 local_c90 [16];
  undefined1 local_c80 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c50;
  options_description *local_c20 [78];
  _Alloc_hider local_9b0;
  size_type local_9a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9a0;
  basic_parsed_options<char> local_990;
  options_description local_968;
  options_description local_8e8;
  undefined1 local_868 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_858;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_828;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7f8;
  options_description local_7c8;
  options_description local_748;
  undefined1 local_6c8 [16];
  undefined1 auStack_6b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_6a8;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  fStack_698;
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_678;
  options_description *local_658;
  _Alloc_hider local_3e8;
  size_type local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  variables_map local_3c8;
  undefined1 local_328 [16];
  basic_option<char> local_318 [7];
  pointer local_48;
  pointer pVStack_40;
  pointer local_38;
  
  local_c90._0_8_ = (options_description *)local_c80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"General options","");
  boost::program_options::options_description::options_description
            (&local_8e8,(string *)local_c90,0x50,0x28);
  if ((options_description *)local_c90._0_8_ != (options_description *)local_c80) {
    operator_delete((void *)local_c90._0_8_,(ulong)(local_c80._0_8_ + 1));
  }
  local_c90._0_8_ = boost::program_options::options_description::add_options(&local_8e8);
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)local_c90,"help,h","Display help message");
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar4,"unpack,u","Unpack volume files");
  boost::program_options::options_description_easy_init::operator()
            (poVar4,"decrypt,d","Decrypt file");
  local_c90._0_8_ = (options_description *)local_c80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"Unpack options","");
  boost::program_options::options_description::options_description
            (&local_748,(string *)local_c90,0x50,0x28);
  if ((options_description *)local_c90._0_8_ != (options_description *)local_c80) {
    operator_delete((void *)local_c90._0_8_,(ulong)(local_c80._0_8_ + 1));
  }
  local_c90._0_8_ = boost::program_options::options_description::add_options(&local_748);
  ptVar5 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)local_c90,"input,i",(value_semantic *)ptVar5,
                      "Volume/Index file");
  ptVar5 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  boost::program_options::options_description_easy_init::operator()
            (poVar4,"output,o",(value_semantic *)ptVar5,"Output directory");
  local_c90._0_8_ = (options_description *)local_c80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"Decrypt options","");
  boost::program_options::options_description::options_description
            (&local_968,(string *)local_c90,0x50,0x28);
  if ((options_description *)local_c90._0_8_ != (options_description *)local_c80) {
    operator_delete((void *)local_c90._0_8_,(ulong)(local_c80._0_8_ + 1));
  }
  local_c90._0_8_ = boost::program_options::options_description::add_options(&local_968);
  ptVar5 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)local_c90,"input,i",(value_semantic *)ptVar5,
                      "Input file");
  ptVar5 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar4,"output,o",(value_semantic *)ptVar5,"Output file");
  ptVar5 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  boost::program_options::options_description_easy_init::operator()
            (poVar4,"key,k",(value_semantic *)ptVar5,"Encryption key");
  boost::program_options::options_description::options_description(&local_7c8,0x50,0x28);
  poVar6 = (options_description *)
           boost::program_options::options_description::add(&local_7c8,&local_8e8);
  poVar6 = (options_description *)
           boost::program_options::options_description::add(poVar6,&local_748);
  boost::program_options::options_description::add(poVar6,&local_968);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_c90,argc,argv);
  boost::program_options::detail::cmdline::style((cmdline *)local_c90,0x3f7);
  boost::program_options::detail::cmdline::allow_unregistered((cmdline *)local_c90);
  boost::program_options::detail::cmdline::set_options_description((cmdline *)local_c90,&local_8e8);
  local_c20[0] = &local_8e8;
  boost::program_options::basic_command_line_parser<char>::run
            (&local_990,(basic_command_line_parser<char> *)local_c90);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1((function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                *)&local_c50._M_impl.super__Rb_tree_header._M_header._M_parent);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)(local_c80 + 0x20));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c90);
  boost::program_options::variables_map::variables_map(&local_3c8);
  boost::program_options::store((basic_parsed_options *)&local_990,&local_3c8,false);
  boost::program_options::collect_unrecognized<char>
            (&local_ca8,&local_990.options,include_positional);
  boost::program_options::notify(&local_3c8);
  local_c90._0_8_ = (options_description *)local_c80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"help","");
  this = &local_3c8.
          super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ;
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(&this->_M_t,(key_type *)local_c90);
  p_Var2 = &local_3c8.
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  if ((options_description *)local_c90._0_8_ != (options_description *)local_c80) {
    operator_delete((void *)local_c90._0_8_,(ulong)(local_c80._0_8_ + 1));
  }
  if ((_Rb_tree_header *)cVar7._M_node == p_Var2) {
    local_c90._0_8_ = (options_description *)local_c80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"decrypt","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(&this->_M_t,(key_type *)local_c90);
    if ((options_description *)local_c90._0_8_ != (options_description *)local_c80) {
      operator_delete((void *)local_c90._0_8_,(ulong)(local_c80._0_8_ + 1));
    }
    if ((_Rb_tree_header *)cVar7._M_node == p_Var2) {
      local_c90._0_8_ = (options_description *)local_c80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"unpack","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::find(&this->_M_t,(key_type *)local_c90);
      if ((options_description *)local_c90._0_8_ != (options_description *)local_c80) {
        operator_delete((void *)local_c90._0_8_,(ulong)(local_c80._0_8_ + 1));
      }
      if ((_Rb_tree_header *)cVar7._M_node == p_Var2) goto LAB_00118399;
      boost::program_options::variables_map::variables_map((variables_map *)local_868);
      boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
                ((basic_command_line_parser<char> *)local_c90,&local_ca8);
      boost::program_options::detail::cmdline::style((cmdline *)local_c90,0x3f7);
      boost::program_options::detail::cmdline::allow_unregistered((cmdline *)local_c90);
      boost::program_options::detail::cmdline::set_options_description
                ((cmdline *)local_c90,&local_968);
      local_c20[0] = &local_968;
      boost::program_options::basic_command_line_parser<char>::run
                ((basic_parsed_options<char> *)local_6c8,
                 (basic_command_line_parser<char> *)local_c90);
      boost::program_options::store
                ((basic_parsed_options *)local_6c8,(variables_map *)local_868,false);
      std::
      vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
      ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                 *)local_6c8);
      boost::
      function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
      ::~function1((function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                    *)&local_c50._M_impl.super__Rb_tree_header._M_header._M_parent);
      boost::
      function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)(local_c80 + 0x20));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_c90);
      boost::program_options::notify((variables_map *)local_868);
      local_c90._0_8_ = (options_description *)local_c80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"input","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::find(&local_858,(key_type *)local_c90);
      p_Var2 = &local_858._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)cVar7._M_node == p_Var2) {
        bVar17 = true;
      }
      else {
        local_cc8._M_dataplus._M_p = (pointer)&local_cc8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_cc8,"output","");
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::find(&local_858,&local_cc8);
        bVar17 = (_Rb_tree_header *)cVar7._M_node == p_Var2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_cc8._M_dataplus._M_p != &local_cc8.field_2) {
          operator_delete(local_cc8._M_dataplus._M_p,local_cc8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((options_description *)local_c90._0_8_ != (options_description *)local_c80) {
        operator_delete((void *)local_c90._0_8_,(ulong)(local_c80._0_8_ + 1));
      }
      iVar15 = 0;
      if (!bVar17) {
        local_c90._0_8_ = (options_description *)local_c80;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"input","");
        paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]
                                  ((abstract_variables_map *)local_868,(string *)local_c90);
        pbVar10 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
        if ((options_description *)local_c90._0_8_ != (options_description *)local_c80) {
          operator_delete((void *)local_c90._0_8_,(ulong)(local_c80._0_8_ + 1));
        }
        local_c90._0_8_ = (options_description *)local_c80;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"output","");
        paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]
                                  ((abstract_variables_map *)local_868,(string *)local_c90);
        pbVar11 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
        if ((options_description *)local_c90._0_8_ != (options_description *)local_c80) {
          operator_delete((void *)local_c90._0_8_,(ulong)(local_c80._0_8_ + 1));
        }
        pcVar3 = (pbVar10->_M_dataplus)._M_p;
        local_c90._0_8_ = (options_description *)local_c80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_c90,pcVar3,pcVar3 + pbVar10->_M_string_length);
        boost::filesystem::detail::status((detail *)local_6c8,(path *)local_c90,(error_code *)0x0);
        bVar18 = true;
        if (1 < (uint)local_6c8._0_4_) {
          local_ce8.m_pathname._M_dataplus._M_p = (pointer)&local_ce8.m_pathname.field_2;
          pcVar3 = (pbVar10->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_ce8,pcVar3,pcVar3 + pbVar10->_M_string_length);
          boost::filesystem::detail::status((detail *)local_6c8,&local_ce8,(error_code *)0x0);
          bVar18 = local_6c8._0_4_ != 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ce8.m_pathname._M_dataplus._M_p != &local_ce8.m_pathname.field_2) {
            operator_delete(local_ce8.m_pathname._M_dataplus._M_p,
                            local_ce8.m_pathname.field_2._M_allocated_capacity + 1);
          }
        }
        if ((options_description *)local_c90._0_8_ != (options_description *)local_c80) {
          operator_delete((void *)local_c90._0_8_,(ulong)(local_c80._0_8_ + 1));
        }
        if (bVar18) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Invalid volume file specified.",0x1e);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
          std::ostream::put(-0x28);
          iVar15 = 1;
          std::ostream::flush();
        }
        else {
          pcVar3 = (pbVar11->_M_dataplus)._M_p;
          local_c90._0_8_ = (options_description *)local_c80;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_c90,pcVar3,pcVar3 + pbVar11->_M_string_length);
          boost::filesystem::detail::status((detail *)local_6c8,(path *)local_c90,(error_code *)0x0)
          ;
          if ((uint)local_6c8._0_4_ < 2) {
            bVar18 = false;
          }
          else {
            local_d08.m_pathname._M_dataplus._M_p = (pointer)&local_d08.m_pathname.field_2;
            pcVar3 = (pbVar11->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d08,pcVar3,pcVar3 + pbVar11->_M_string_length);
            boost::filesystem::detail::status((detail *)local_6c8,&local_d08,(error_code *)0x0);
            bVar18 = local_6c8._0_4_ != 3;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d08.m_pathname._M_dataplus._M_p != &local_d08.m_pathname.field_2) {
              operator_delete(local_d08.m_pathname._M_dataplus._M_p,
                              local_d08.m_pathname.field_2._M_allocated_capacity + 1);
            }
          }
          if ((options_description *)local_c90._0_8_ != (options_description *)local_c80) {
            operator_delete((void *)local_c90._0_8_,(ulong)(local_c80._0_8_ + 1));
          }
          if (bVar18) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Invalid output directory specified.",0x23);
            iVar15 = 1;
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          }
          else {
            VolumeFile::VolumeFile((VolumeFile *)local_c90,true);
            local_9b0._M_p = (pointer)&local_9a0;
            local_c90._0_8_ = &PTR__GT5VolumeFile_0017f738;
            local_9a8 = 0;
            local_9a0._M_local_buf[0] = '\0';
            VolumeFile::VolumeFile((VolumeFile *)local_6c8,true);
            local_3e8._M_p = (pointer)&local_3d8;
            local_3e0 = 0;
            local_3d8._M_local_buf[0] = '\0';
            local_6c8._0_8_ = &PTR__GT5VolumeFile_0017f808;
            VolumeFile::VolumeFile((VolumeFile *)local_328,false);
            local_328._0_8_ = &PTR__GT7VolumeFile_0017f7a0;
            local_48 = (pointer)0x0;
            pVStack_40 = (pointer)0x0;
            local_38 = (pointer)0x0;
            local_d28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_c90;
            local_d28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_6c8;
            local_d28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_328;
            lVar14 = 0;
            this_01 = (VolumeFile *)0x0;
            do {
              this_00 = *(VolumeFile **)
                         ((long)&local_d28.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar14);
              bVar18 = VolumeFile::load(this_00,pbVar10);
              if (bVar18) {
                this_01 = this_00;
              }
              bVar19 = lVar14 != 0x10;
              lVar14 = lVar14 + 8;
            } while (bVar19 && !bVar18);
            if (this_01 == (VolumeFile *)0x0) {
              lVar14 = 0x1b;
              pcVar16 = "Unable to load volume file.";
LAB_001193f7:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,pcVar16,lVar14);
              iVar15 = 1;
              std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Unpacking files...",0x12);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              bVar18 = VolumeFile::unpackAll(this_01,pbVar11);
              if (!bVar18) {
                lVar14 = 0x1d;
                pcVar16 = "Unable to unpack volume file.";
                goto LAB_001193f7;
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done!",5);
              iVar15 = 0;
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            }
            GT7VolumeFile::~GT7VolumeFile((GT7VolumeFile *)local_328);
            GT5VolumeFile::~GT5VolumeFile((GT5VolumeFile *)local_6c8);
            GT5VolumeFile::~GT5VolumeFile((GT5VolumeFile *)local_c90);
          }
        }
      }
      local_868._0_8_ = &PTR__variables_map_0017dea8;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_7f8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_828);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
      ::~_Rb_tree(&local_858);
    }
    else {
      boost::program_options::variables_map::variables_map((variables_map *)local_c90);
      boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
                ((basic_command_line_parser<char> *)local_6c8,&local_ca8);
      boost::program_options::detail::cmdline::style((cmdline *)local_6c8,0x3f7);
      boost::program_options::detail::cmdline::allow_unregistered((cmdline *)local_6c8);
      boost::program_options::detail::cmdline::set_options_description
                ((cmdline *)local_6c8,&local_968);
      local_658 = &local_968;
      boost::program_options::basic_command_line_parser<char>::run
                ((basic_parsed_options<char> *)local_328,
                 (basic_command_line_parser<char> *)local_6c8);
      boost::program_options::store
                ((basic_parsed_options *)local_328,(variables_map *)local_c90,false);
      std::
      vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
      ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                 *)local_328);
      boost::
      function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
      ::~function1(&local_678);
      boost::
      function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~function1(&fStack_698);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_6c8);
      boost::program_options::notify((variables_map *)local_c90);
      local_6c8._0_8_ = (pointer)auStack_6b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,"input","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)local_c80,(key_type *)local_6c8);
      p_Var1 = (_Base_ptr)(local_c80 + 8);
      bVar17 = true;
      if (cVar7._M_node == p_Var1) {
LAB_00118859:
        bVar18 = false;
      }
      else {
        local_328._0_8_ = local_318;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"output","");
        cVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                        *)local_c80,(key_type *)local_328);
        if (cVar8._M_node == p_Var1) goto LAB_00118859;
        local_868._0_8_ = &local_858;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_868,"key","");
        cVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                        *)local_c80,(key_type *)local_868);
        bVar17 = cVar8._M_node == p_Var1;
        bVar18 = true;
      }
      if ((bVar18) &&
         ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           *)local_868._0_8_ != &local_858)) {
        operator_delete((void *)local_868._0_8_,local_858._M_impl._0_8_ + 1);
      }
      if ((cVar7._M_node != p_Var1) && ((basic_option<char> *)local_328._0_8_ != local_318)) {
        operator_delete((void *)local_328._0_8_,
                        (ulong)(local_318[0].string_key._M_dataplus._M_p + 1));
      }
      if ((pointer)local_6c8._0_8_ != (pointer)auStack_6b8) {
        operator_delete((void *)local_6c8._0_8_,(ulong)(auStack_6b8._0_8_ + 1));
      }
      iVar15 = 0;
      if (!bVar17) {
        local_6c8._0_8_ = (pointer)auStack_6b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,"input","");
        paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]
                                  ((abstract_variables_map *)local_c90,(string *)local_6c8);
        pbVar10 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
        if ((pointer)local_6c8._0_8_ != (pointer)auStack_6b8) {
          operator_delete((void *)local_6c8._0_8_,(ulong)(auStack_6b8._0_8_ + 1));
        }
        local_6c8._0_8_ = (pointer)auStack_6b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,"output","");
        paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]
                                  ((abstract_variables_map *)local_c90,(string *)local_6c8);
        pbVar11 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
        if ((pointer)local_6c8._0_8_ != (pointer)auStack_6b8) {
          operator_delete((void *)local_6c8._0_8_,(ulong)(auStack_6b8._0_8_ + 1));
        }
        local_6c8._0_8_ = (pointer)auStack_6b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,"key","");
        paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]
                                  ((abstract_variables_map *)local_c90,(string *)local_6c8);
        pbVar12 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
        if ((pointer)local_6c8._0_8_ != (pointer)auStack_6b8) {
          operator_delete((void *)local_6c8._0_8_,(ulong)(auStack_6b8._0_8_ + 1));
        }
        local_cc8._M_dataplus._M_p = (pointer)0x0;
        local_cc8._M_string_length = 0;
        local_cc8.field_2._M_allocated_capacity = 0;
        local_cc8.field_2._8_8_ = 0;
        sVar13 = parseHexString((pbVar12->_M_dataplus)._M_p,(uint8_t *)&local_cc8,0x20);
        if (sVar13 == 0x20) {
          pcVar3 = (pbVar10->_M_dataplus)._M_p;
          local_6c8._0_8_ = (pointer)auStack_6b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_6c8,pcVar3,pcVar3 + pbVar10->_M_string_length);
          boost::filesystem::detail::status
                    ((detail *)&local_ce8,(path *)local_6c8,(error_code *)0x0);
          bVar18 = true;
          if (1 < (uint)local_ce8.m_pathname._M_dataplus._M_p) {
            local_ce8.m_pathname._M_dataplus._M_p = (pointer)&local_ce8.m_pathname.field_2;
            pcVar3 = (pbVar10->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_ce8,pcVar3,pcVar3 + pbVar10->_M_string_length);
            boost::filesystem::detail::status((detail *)&local_d08,&local_ce8,(error_code *)0x0);
            bVar18 = (uint)local_d08.m_pathname._M_dataplus._M_p != 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ce8.m_pathname._M_dataplus._M_p != &local_ce8.m_pathname.field_2) {
              operator_delete(local_ce8.m_pathname._M_dataplus._M_p,
                              local_ce8.m_pathname.field_2._M_allocated_capacity + 1);
            }
          }
          if ((pointer)local_6c8._0_8_ != (pointer)auStack_6b8) {
            operator_delete((void *)local_6c8._0_8_,(ulong)(auStack_6b8._0_8_ + 1));
          }
          if (!bVar18) {
            pcVar3 = (pbVar11->_M_dataplus)._M_p;
            local_6c8._0_8_ = (pointer)auStack_6b8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_6c8,pcVar3,pcVar3 + pbVar11->_M_string_length);
            boost::filesystem::detail::status
                      ((detail *)&local_d08,(path *)local_6c8,(error_code *)0x0);
            if ((uint)local_d08.m_pathname._M_dataplus._M_p < 2) {
              bVar18 = false;
            }
            else {
              local_d08.m_pathname._M_dataplus._M_p = (pointer)&local_d08.m_pathname.field_2;
              pcVar3 = (pbVar11->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d08,pcVar3,pcVar3 + pbVar11->_M_string_length);
              boost::filesystem::detail::status((detail *)&local_d28,&local_d08,(error_code *)0x0);
              bVar18 = (int)local_d28.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start != 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d08.m_pathname._M_dataplus._M_p != &local_d08.m_pathname.field_2) {
                operator_delete(local_d08.m_pathname._M_dataplus._M_p,
                                local_d08.m_pathname.field_2._M_allocated_capacity + 1);
              }
            }
            if ((pointer)local_6c8._0_8_ != (pointer)auStack_6b8) {
              operator_delete((void *)local_6c8._0_8_,(ulong)(auStack_6b8._0_8_ + 1));
            }
            if (bVar18) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Invalid output file specified.",0x1e);
              iVar15 = 1;
              std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            }
            else {
              local_d28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_d28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_d28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              bVar18 = loadFromFile(pbVar10,&local_d28);
              if (bVar18) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Decrypting file...",0x12);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                local_6c8._0_8_ = (pointer)0x0;
                local_6c8._8_8_ = (pointer)0x0;
                auStack_6b8._0_8_ = (pointer)0x0;
                auStack_6b8._8_8_ = 0;
                aStack_6a8._M_allocated_capacity = 0;
                aStack_6a8._8_8_ = (positional_options_description *)0x0;
                fStack_698.super_function_base.vtable = (vtable_base *)0x0;
                fStack_698.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
                Salsa20Cipher::setKey((Salsa20Cipher *)local_6c8,(uint8_t *)&local_cc8,0x20);
                auStack_6b8._8_8_ = 0;
                aStack_6a8._M_allocated_capacity = 0;
                Salsa20Cipher::processBytes
                          ((Salsa20Cipher *)local_6c8,
                           local_d28.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                           local_d28.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                           (long)local_d28.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_d28.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
                bVar18 = saveToFile(pbVar11,local_d28.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_d28.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_d28.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                if (bVar18) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Done!",5);
                  iVar15 = 0;
                  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Unable to load input file.",0x1a);
                  iVar15 = 1;
                  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Unable to load input file.",0x1a);
                iVar15 = 1;
                std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
              }
              if ((VolumeFile *)
                  local_d28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (VolumeFile *)0x0) {
                operator_delete(local_d28.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_d28.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_d28.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            goto LAB_00118ccd;
          }
          lVar14 = 0x1d;
          pcVar16 = "Invalid input file specified.";
        }
        else {
          lVar14 = 0x16;
          pcVar16 = "Invalid key specified.";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar16,lVar14);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
        std::ostream::put(-0x28);
        iVar15 = 1;
        std::ostream::flush();
      }
LAB_00118ccd:
      local_c90._0_8_ = &PTR__variables_map_0017dea8;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_c20);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_c50);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)local_c80);
    }
    if (!bVar17) goto LAB_001183f5;
  }
LAB_00118399:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"GT Tool (c) flatz, 2018",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  iVar15 = 0;
  boost::program_options::operator<<((ostream *)&std::cout,&local_7c8);
LAB_001183f5:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_ca8);
  local_3c8.super_abstract_variables_map._vptr_abstract_variables_map =
       (_func_int **)&PTR__variables_map_0017dea8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_3c8.m_required._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_3c8.m_final._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(&this->_M_t);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_990.options);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(&local_7c8.groups);
  if (local_7c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_7c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_7c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_7c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_7c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_7c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_7c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_7c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_7c8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(&local_7c8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8.m_caption._M_dataplus._M_p != &local_7c8.m_caption.field_2) {
    operator_delete(local_7c8.m_caption._M_dataplus._M_p,
                    local_7c8.m_caption.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(&local_968.groups);
  if (local_968.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_968.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_968.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_968.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_968.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_968.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_968.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_968.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_968.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(&local_968.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968.m_caption._M_dataplus._M_p != &local_968.m_caption.field_2) {
    operator_delete(local_968.m_caption._M_dataplus._M_p,
                    local_968.m_caption.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(&local_748.groups);
  if (local_748.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_748.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_748.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_748.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_748.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_748.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_748.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_748.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_748.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(&local_748.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748.m_caption._M_dataplus._M_p != &local_748.m_caption.field_2) {
    operator_delete(local_748.m_caption._M_dataplus._M_p,
                    local_748.m_caption.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(&local_8e8.groups);
  if (local_8e8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_8e8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_8e8.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_8e8.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_8e8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_8e8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_8e8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_8e8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_8e8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(&local_8e8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.m_caption._M_dataplus._M_p != &local_8e8.m_caption.field_2) {
    operator_delete(local_8e8.m_caption._M_dataplus._M_p,
                    local_8e8.m_caption.field_2._M_allocated_capacity + 1);
  }
  return iVar15;
}

Assistant:

int main(int argc, const char* argv[])
{
	try {
		boost::program_options::options_description generalOpts("General options");
		generalOpts.add_options()
			("help,h", "Display help message")
			("unpack,u", "Unpack volume files")
			("decrypt,d", "Decrypt file")
		;

		boost::program_options::options_description unpackOpts("Unpack options");
		unpackOpts.add_options()
			("input,i", boost::program_options::value<std::string>(), "Volume/Index file")
			("output,o", boost::program_options::value<std::string>(), "Output directory")
		;

		boost::program_options::options_description decryptOpts("Decrypt options");
		decryptOpts.add_options()
			("input,i", boost::program_options::value<std::string>(), "Input file")
			("output,o", boost::program_options::value<std::string>(), "Output file")
			("key,k", boost::program_options::value<std::string>(), "Encryption key")
		;

		boost::program_options::options_description allOpts;
		allOpts.add(generalOpts).add(unpackOpts).add(decryptOpts);

		auto parsedOpts = boost::program_options::command_line_parser(argc, argv)
			.style(boost::program_options::command_line_style::unix_style)
			.allow_unregistered()
			.options(generalOpts)
			.run();

		boost::program_options::variables_map varMap;
		boost::program_options::store(parsedOpts, varMap);
		const auto restParams = boost::program_options::collect_unrecognized(parsedOpts.options, boost::program_options::include_positional);
		boost::program_options::notify(varMap);

		if (varMap.count("help")) {
show_help:
			std::cout << "GT Tool (c) flatz, 2018" << std::endl;
			std::cout << allOpts;
		} else if (varMap.count("decrypt")) {
			boost::program_options::variables_map restVarMap;
			boost::program_options::store(
				boost::program_options::command_line_parser(restParams)
					.style(boost::program_options::command_line_style::unix_style)
					.allow_unregistered()
					.options(decryptOpts)
					.run(),
				restVarMap
			);
			boost::program_options::notify(restVarMap);

			if (!restVarMap.count("input") || !restVarMap.count("output") || !restVarMap.count("key")) {
				goto show_help;
			}

			const auto& inFile = restVarMap["input"].as<std::string>();
			const auto& outFile = restVarMap["output"].as<std::string>();
			const auto& keyStr = restVarMap["key"].as<std::string>();

			uint8_t key[0x20] = {};
			if (parseHexString(keyStr, key, sizeof(key)) != sizeof(key)) {
				std::cerr << "Invalid key specified." << std::endl;
				return EXIT_FAILURE;
			}

			if (!boost::filesystem::exists(inFile) || !boost::filesystem::is_regular_file(inFile)) {
				std::cerr << "Invalid input file specified." << std::endl;
				return EXIT_FAILURE;
			}
			if (boost::filesystem::exists(outFile) && !boost::filesystem::is_regular_file(outFile)) {
				std::cerr << "Invalid output file specified." << std::endl;
				return EXIT_FAILURE;
			}

			std::vector<uint8_t> data;
			if (!loadFromFile(inFile, data)) {
				std::cerr << "Unable to load input file." << std::endl;
				return EXIT_FAILURE;
			}

			std::cout << "Decrypting file..." << std::endl;

			Salsa20Cipher cipher(key, sizeof(key));
			cipher.processBytes(data.data(), data.data(), data.size());

			if (!saveToFile(outFile, data.data(), data.size())) {
				std::cerr << "Unable to load input file." << std::endl;
				return EXIT_FAILURE;
			}

			std::cout << "Done!" << std::endl;
			return EXIT_SUCCESS;
		} else if (varMap.count("unpack")) {
			boost::program_options::variables_map restVarMap;
			boost::program_options::store(
				boost::program_options::command_line_parser(restParams)
					.style(boost::program_options::command_line_style::unix_style)
					.allow_unregistered()
					.options(decryptOpts)
					.run(),
				restVarMap
			);
			boost::program_options::notify(restVarMap);

			if (!restVarMap.count("input") || !restVarMap.count("output")) {
				goto show_help;
			}

			const auto& inFile = restVarMap["input"].as<std::string>();
			const auto& outDir = restVarMap["output"].as<std::string>();

			if (!boost::filesystem::exists(inFile) || !boost::filesystem::is_regular_file(inFile)) {
				std::cerr << "Invalid volume file specified." << std::endl;
				return EXIT_FAILURE;
			}
			if (boost::filesystem::exists(outDir) && !boost::filesystem::is_directory(outDir)) {
				std::cerr << "Invalid output directory specified." << std::endl;
				return EXIT_FAILURE;
			}

			GT5VolumeFile vol5;
			GT6VolumeFile vol6;
			GT7VolumeFile vol7;
			std::array<VolumeFile*, 3> volumes = {{ &vol5, &vol6, &vol7 }};
			VolumeFile* volume = nullptr;
			for (auto vol: volumes) {
				if (vol->load(inFile)) {
					volume = vol;
					break;
				}
			}
			if (!volume) {
				std::cerr << "Unable to load volume file." << std::endl;
				return EXIT_FAILURE;
			}

			std::cout << "Unpacking files..." << std::endl;
			if (!volume->unpackAll(outDir)) {
				std::cerr << "Unable to unpack volume file." << std::endl;
				return EXIT_FAILURE;
			}

			std::cout << "Done!" << std::endl;
			return EXIT_SUCCESS;
		} else {
			goto show_help;
		}
	}
	catch (const std::exception& e) {
		std::cerr << "Unhandled error occurred:" << std::endl << e.what() << std::endl;
		return EXIT_FAILURE;
	}

	return 0;
}